

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

void pospopcnt_u8_avx2_horizreduce(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  __m256i x;
  __m256i x_00;
  __m256i x_01;
  __m256i x_02;
  __m256i x_03;
  __m256i x_04;
  __m256i x_05;
  __m256i x_06;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i a;
  __m256i b_03;
  __m256i a_00;
  __m256i b_04;
  __m256i a_01;
  __m256i a_02;
  __m256i b_05;
  __m256i b_06;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  uint64_t uVar18;
  uint32_t *in_RDX;
  ulong in_RSI;
  uint8_t *in_RDI;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar23 [16];
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined1 auVar32 [16];
  __m256i sum7;
  __m256i sum6;
  __m256i sum5;
  __m256i sum4;
  __m256i sum3;
  __m256i sum2;
  __m256i sum1;
  __m256i sum0;
  __m256i mask_hi;
  __m256i mask_lo;
  __m256i d3;
  __m256i d2;
  __m256i d1;
  __m256i d0;
  __m256i s3;
  __m256i s2;
  __m256i s1;
  __m256i s0;
  __m256i r3;
  __m256i r2;
  __m256i r1;
  __m256i r0;
  uint8_t *end;
  __m256i counter_h;
  __m256i counter_g;
  __m256i counter_f;
  __m256i counter_e;
  __m256i counter_d;
  __m256i counter_c;
  __m256i counter_b;
  __m256i counter_a;
  __m256i zero;
  undefined1 in_stack_fffffffffffff6a0 [24];
  undefined8 in_stack_fffffffffffff6d8;
  undefined8 in_stack_fffffffffffff6e0;
  undefined8 in_stack_fffffffffffff6e8;
  longlong in_stack_fffffffffffff6f0;
  undefined8 in_stack_fffffffffffff6f8;
  undefined8 in_stack_fffffffffffff700;
  undefined8 in_stack_fffffffffffff708;
  longlong in_stack_fffffffffffff710;
  undefined8 in_stack_fffffffffffff718;
  undefined8 in_stack_fffffffffffff720;
  undefined8 in_stack_fffffffffffff728;
  longlong in_stack_fffffffffffff730;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  uint8_t *local_528;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_580 = ZEXT1632(ZEXT816(0));
  local_5a0 = ZEXT1632(ZEXT816(0));
  local_5c0 = ZEXT1632(ZEXT816(0));
  local_5e0 = ZEXT1632(ZEXT816(0));
  local_600 = ZEXT1632(ZEXT816(0));
  local_620 = ZEXT1632(ZEXT816(0));
  local_640 = ZEXT1632(ZEXT816(0));
  local_660 = ZEXT1632(ZEXT816(0));
  for (local_528 = in_RDI; local_528 != in_RDI + (in_RSI & 0xffffffffffffff80);
      local_528 = local_528 + 0x80) {
    uVar20 = *(undefined8 *)local_528;
    uVar25 = *(undefined8 *)(local_528 + 8);
    uVar29 = *(undefined8 *)(local_528 + 0x10);
    uVar34 = *(undefined8 *)(local_528 + 0x18);
    a[1] = in_stack_fffffffffffff700;
    a[0] = in_stack_fffffffffffff6f8;
    a[2] = in_stack_fffffffffffff708;
    a[3] = in_stack_fffffffffffff710;
    b[1] = in_stack_fffffffffffff6e0;
    b[0] = in_stack_fffffffffffff6d8;
    b[2] = in_stack_fffffffffffff6e8;
    b[3] = in_stack_fffffffffffff6f0;
    uVar19 = uVar20;
    uVar24 = uVar25;
    uVar28 = uVar29;
    uVar33 = uVar34;
    avx2_add1_even(a,b);
    a_03[1] = in_stack_fffffffffffff720;
    a_03[0] = in_stack_fffffffffffff718;
    a_03[2] = in_stack_fffffffffffff728;
    a_03[3] = in_stack_fffffffffffff730;
    b_03[1] = in_stack_fffffffffffff700;
    b_03[0] = in_stack_fffffffffffff6f8;
    b_03[2] = in_stack_fffffffffffff708;
    b_03[3] = in_stack_fffffffffffff710;
    avx2_add1_odd(a_03,b_03);
    a_00[1] = in_stack_fffffffffffff700;
    a_00[0] = in_stack_fffffffffffff6f8;
    a_00[2] = in_stack_fffffffffffff708;
    a_00[3] = in_stack_fffffffffffff710;
    b_00[1] = in_stack_fffffffffffff6e0;
    b_00[0] = in_stack_fffffffffffff6d8;
    b_00[2] = in_stack_fffffffffffff6e8;
    b_00[3] = in_stack_fffffffffffff6f0;
    avx2_add1_even(a_00,b_00);
    a_04[1] = in_stack_fffffffffffff720;
    a_04[0] = in_stack_fffffffffffff718;
    a_04[2] = in_stack_fffffffffffff728;
    a_04[3] = in_stack_fffffffffffff730;
    b_04[1] = in_stack_fffffffffffff700;
    b_04[0] = in_stack_fffffffffffff6f8;
    b_04[2] = in_stack_fffffffffffff708;
    b_04[3] = in_stack_fffffffffffff710;
    avx2_add1_odd(a_04,b_04);
    a_01[1] = in_stack_fffffffffffff700;
    a_01[0] = in_stack_fffffffffffff6f8;
    a_01[2] = in_stack_fffffffffffff708;
    a_01[3] = in_stack_fffffffffffff710;
    b_01[1] = in_stack_fffffffffffff6e0;
    b_01[0] = in_stack_fffffffffffff6d8;
    b_01[2] = in_stack_fffffffffffff6e8;
    b_01[3] = in_stack_fffffffffffff6f0;
    uVar21 = uVar19;
    uVar26 = uVar24;
    uVar30 = uVar28;
    uVar35 = uVar33;
    avx2_add2_even(a_01,b_01);
    a_02[1] = in_stack_fffffffffffff700;
    a_02[0] = in_stack_fffffffffffff6f8;
    a_02[2] = in_stack_fffffffffffff708;
    a_02[3] = in_stack_fffffffffffff710;
    b_02[1] = in_stack_fffffffffffff6e0;
    b_02[0] = in_stack_fffffffffffff6d8;
    b_02[2] = in_stack_fffffffffffff6e8;
    b_02[3] = in_stack_fffffffffffff6f0;
    uVar22 = uVar20;
    uVar27 = uVar25;
    uVar31 = uVar29;
    uVar36 = uVar34;
    avx2_add2_even(a_02,b_02);
    a_05[1] = in_stack_fffffffffffff720;
    a_05[0] = in_stack_fffffffffffff718;
    a_05[2] = in_stack_fffffffffffff728;
    a_05[3] = in_stack_fffffffffffff730;
    b_05[1] = in_stack_fffffffffffff700;
    b_05[0] = in_stack_fffffffffffff6f8;
    b_05[2] = in_stack_fffffffffffff708;
    b_05[3] = in_stack_fffffffffffff710;
    avx2_add2_odd(a_05,b_05);
    a_06[1] = in_stack_fffffffffffff720;
    a_06[0] = in_stack_fffffffffffff718;
    a_06[2] = in_stack_fffffffffffff728;
    a_06[3] = in_stack_fffffffffffff730;
    b_06[1] = in_stack_fffffffffffff700;
    b_06[0] = in_stack_fffffffffffff6f8;
    b_06[2] = in_stack_fffffffffffff708;
    b_06[3] = in_stack_fffffffffffff710;
    avx2_add2_odd(a_06,b_06);
    auVar1 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
    auVar1 = vpinsrb_avx(auVar1,0xf,2);
    auVar1 = vpinsrb_avx(auVar1,0xf,3);
    auVar1 = vpinsrb_avx(auVar1,0xf,4);
    auVar1 = vpinsrb_avx(auVar1,0xf,5);
    auVar1 = vpinsrb_avx(auVar1,0xf,6);
    auVar1 = vpinsrb_avx(auVar1,0xf,7);
    auVar1 = vpinsrb_avx(auVar1,0xf,8);
    auVar1 = vpinsrb_avx(auVar1,0xf,9);
    auVar1 = vpinsrb_avx(auVar1,0xf,10);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xb);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xc);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xd);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xe);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xf);
    auVar32 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
    auVar32 = vpinsrb_avx(auVar32,0xf,2);
    auVar32 = vpinsrb_avx(auVar32,0xf,3);
    auVar32 = vpinsrb_avx(auVar32,0xf,4);
    auVar32 = vpinsrb_avx(auVar32,0xf,5);
    auVar32 = vpinsrb_avx(auVar32,0xf,6);
    auVar32 = vpinsrb_avx(auVar32,0xf,7);
    auVar32 = vpinsrb_avx(auVar32,0xf,8);
    auVar32 = vpinsrb_avx(auVar32,0xf,9);
    auVar32 = vpinsrb_avx(auVar32,0xf,10);
    auVar32 = vpinsrb_avx(auVar32,0xf,0xb);
    auVar32 = vpinsrb_avx(auVar32,0xf,0xc);
    auVar32 = vpinsrb_avx(auVar32,0xf,0xd);
    auVar32 = vpinsrb_avx(auVar32,0xf,0xe);
    auVar32 = vpinsrb_avx(auVar32,0xf,0xf);
    uStack_b0 = auVar32._0_8_;
    uStack_a8 = auVar32._8_8_;
    auVar32 = vpinsrb_avx(ZEXT116(0xf0),0xf0,1);
    auVar32 = vpinsrb_avx(auVar32,0xf0,2);
    auVar32 = vpinsrb_avx(auVar32,0xf0,3);
    auVar32 = vpinsrb_avx(auVar32,0xf0,4);
    auVar32 = vpinsrb_avx(auVar32,0xf0,5);
    auVar32 = vpinsrb_avx(auVar32,0xf0,6);
    auVar32 = vpinsrb_avx(auVar32,0xf0,7);
    auVar32 = vpinsrb_avx(auVar32,0xf0,8);
    auVar32 = vpinsrb_avx(auVar32,0xf0,9);
    auVar32 = vpinsrb_avx(auVar32,0xf0,10);
    auVar32 = vpinsrb_avx(auVar32,0xf0,0xb);
    auVar32 = vpinsrb_avx(auVar32,0xf0,0xc);
    auVar32 = vpinsrb_avx(auVar32,0xf0,0xd);
    auVar32 = vpinsrb_avx(auVar32,0xf0,0xe);
    auVar32 = vpinsrb_avx(auVar32,0xf0,0xf);
    auVar23 = vpinsrb_avx(ZEXT116(0xf0),0xf0,1);
    auVar23 = vpinsrb_avx(auVar23,0xf0,2);
    auVar23 = vpinsrb_avx(auVar23,0xf0,3);
    auVar23 = vpinsrb_avx(auVar23,0xf0,4);
    auVar23 = vpinsrb_avx(auVar23,0xf0,5);
    auVar23 = vpinsrb_avx(auVar23,0xf0,6);
    auVar23 = vpinsrb_avx(auVar23,0xf0,7);
    auVar23 = vpinsrb_avx(auVar23,0xf0,8);
    auVar23 = vpinsrb_avx(auVar23,0xf0,9);
    auVar23 = vpinsrb_avx(auVar23,0xf0,10);
    auVar23 = vpinsrb_avx(auVar23,0xf0,0xb);
    auVar23 = vpinsrb_avx(auVar23,0xf0,0xc);
    auVar23 = vpinsrb_avx(auVar23,0xf0,0xd);
    auVar23 = vpinsrb_avx(auVar23,0xf0,0xe);
    auVar23 = vpinsrb_avx(auVar23,0xf0,0xf);
    auVar23 = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar23;
    auVar32 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar32;
    uStack_70 = auVar32._0_8_;
    uStack_68 = auVar32._8_8_;
    auVar4._8_8_ = uVar26;
    auVar4._0_8_ = uVar21;
    auVar4._16_8_ = uVar30;
    auVar4._24_8_ = uVar35;
    auVar3._16_8_ = uStack_b0;
    auVar3._0_16_ = auVar1;
    auVar3._24_8_ = uStack_a8;
    auVar2 = vpand_avx2(auVar4,auVar3);
    auVar3 = vpsadbw_avx2(auVar2,ZEXT1632(ZEXT816(0)));
    auVar17._8_8_ = uVar26;
    auVar17._0_8_ = uVar21;
    auVar17._16_8_ = uVar30;
    auVar17._24_8_ = uVar35;
    auVar2._16_8_ = uStack_70;
    auVar2._0_16_ = auVar23;
    auVar2._24_8_ = uStack_68;
    auVar2 = vpand_avx2(auVar17,auVar2);
    auVar4 = vpsadbw_avx2(auVar2,ZEXT1632(ZEXT816(0)));
    auVar15._8_8_ = uVar27;
    auVar15._0_8_ = uVar22;
    auVar15._16_8_ = uVar31;
    auVar15._24_8_ = uVar36;
    auVar5._16_8_ = uStack_b0;
    auVar5._0_16_ = auVar1;
    auVar5._24_8_ = uStack_a8;
    auVar2 = vpand_avx2(auVar15,auVar5);
    auVar5 = vpsadbw_avx2(auVar2,ZEXT1632(ZEXT816(0)));
    auVar16._8_8_ = uVar27;
    auVar16._0_8_ = uVar22;
    auVar16._16_8_ = uVar31;
    auVar16._24_8_ = uVar36;
    auVar6._16_8_ = uStack_70;
    auVar6._0_16_ = auVar23;
    auVar6._24_8_ = uStack_68;
    auVar2 = vpand_avx2(auVar16,auVar6);
    auVar6 = vpsadbw_avx2(auVar2,ZEXT1632(ZEXT816(0)));
    auVar13._8_8_ = uVar24;
    auVar13._0_8_ = uVar19;
    auVar13._16_8_ = uVar28;
    auVar13._24_8_ = uVar33;
    auVar7._16_8_ = uStack_b0;
    auVar7._0_16_ = auVar1;
    auVar7._24_8_ = uStack_a8;
    auVar2 = vpand_avx2(auVar13,auVar7);
    auVar7 = vpsadbw_avx2(auVar2,ZEXT1632(ZEXT816(0)));
    in_stack_fffffffffffff720 = auVar7._0_8_;
    in_stack_fffffffffffff728 = auVar7._8_8_;
    in_stack_fffffffffffff730 = auVar7._16_8_;
    auVar14._8_8_ = uVar24;
    auVar14._0_8_ = uVar19;
    auVar14._16_8_ = uVar28;
    auVar14._24_8_ = uVar33;
    auVar8._16_8_ = uStack_70;
    auVar8._0_16_ = auVar23;
    auVar8._24_8_ = uStack_68;
    auVar2 = vpand_avx2(auVar14,auVar8);
    auVar8 = vpsadbw_avx2(auVar2,ZEXT1632(ZEXT816(0)));
    in_stack_fffffffffffff700 = auVar8._0_8_;
    in_stack_fffffffffffff708 = auVar8._8_8_;
    in_stack_fffffffffffff710 = auVar8._16_8_;
    in_stack_fffffffffffff718 = auVar8._24_8_;
    auVar11._8_8_ = uVar25;
    auVar11._0_8_ = uVar20;
    auVar11._16_8_ = uVar29;
    auVar11._24_8_ = uVar34;
    auVar9._16_8_ = uStack_b0;
    auVar9._0_16_ = auVar1;
    auVar9._24_8_ = uStack_a8;
    auVar2 = vpand_avx2(auVar11,auVar9);
    auVar9 = vpsadbw_avx2(auVar2,ZEXT1632(ZEXT816(0)));
    in_stack_fffffffffffff6e0 = auVar9._0_8_;
    in_stack_fffffffffffff6e8 = auVar9._8_8_;
    in_stack_fffffffffffff6f0 = auVar9._16_8_;
    in_stack_fffffffffffff6f8 = auVar9._24_8_;
    auVar12._8_8_ = uVar25;
    auVar12._0_8_ = uVar20;
    auVar12._16_8_ = uVar29;
    auVar12._24_8_ = uVar34;
    auVar10._16_8_ = uStack_70;
    auVar10._0_16_ = auVar23;
    auVar10._24_8_ = uStack_68;
    auVar2 = vpand_avx2(auVar12,auVar10);
    auVar2 = vpsadbw_avx2(auVar2,ZEXT1632(ZEXT816(0)));
    in_stack_fffffffffffff6d8 = auVar2._24_8_;
    local_580 = vpaddq_avx2(local_580,auVar3);
    local_5a0 = vpaddq_avx2(local_5a0,auVar4);
    local_5c0 = vpaddq_avx2(local_5c0,auVar5);
    local_5e0 = vpaddq_avx2(local_5e0,auVar6);
    local_600 = vpaddq_avx2(local_600,auVar7);
    local_620 = vpaddq_avx2(local_620,auVar8);
    local_640 = vpaddq_avx2(local_640,auVar9);
    local_660 = vpaddq_avx2(local_660,auVar2);
  }
  x[1] = in_stack_fffffffffffff6a0._0_8_;
  x[2] = in_stack_fffffffffffff6a0._8_8_;
  x[3] = in_stack_fffffffffffff6a0._16_8_;
  x[0] = 0x15f711;
  uVar18 = avx2_sum_epu64(x);
  *in_RDX = *in_RDX + (int)uVar18;
  x_00[1] = in_stack_fffffffffffff6a0._0_8_;
  x_00[2] = in_stack_fffffffffffff6a0._8_8_;
  x_00[3] = in_stack_fffffffffffff6a0._16_8_;
  x_00[0] = 0x15f731;
  uVar18 = avx2_sum_epu64(x_00);
  in_RDX[1] = in_RDX[1] + (int)uVar18;
  x_01[1] = in_stack_fffffffffffff6a0._0_8_;
  x_01[2] = in_stack_fffffffffffff6a0._8_8_;
  x_01[3] = in_stack_fffffffffffff6a0._16_8_;
  x_01[0] = 0x15f753;
  uVar18 = avx2_sum_epu64(x_01);
  in_RDX[2] = in_RDX[2] + (int)uVar18;
  x_02[1] = in_stack_fffffffffffff6a0._0_8_;
  x_02[2] = in_stack_fffffffffffff6a0._8_8_;
  x_02[3] = in_stack_fffffffffffff6a0._16_8_;
  x_02[0] = 0x15f775;
  uVar18 = avx2_sum_epu64(x_02);
  in_RDX[3] = in_RDX[3] + (int)uVar18;
  x_03[1] = in_stack_fffffffffffff6a0._0_8_;
  x_03[2] = in_stack_fffffffffffff6a0._8_8_;
  x_03[3] = in_stack_fffffffffffff6a0._16_8_;
  x_03[0] = 0x15f797;
  uVar18 = avx2_sum_epu64(x_03);
  in_RDX[4] = in_RDX[4] + (int)(uVar18 >> 4);
  x_04[1] = in_stack_fffffffffffff6a0._0_8_;
  x_04[2] = in_stack_fffffffffffff6a0._8_8_;
  x_04[3] = in_stack_fffffffffffff6a0._16_8_;
  x_04[0] = 0x15f7bd;
  uVar18 = avx2_sum_epu64(x_04);
  in_RDX[5] = in_RDX[5] + (int)(uVar18 >> 4);
  x_05[1] = in_stack_fffffffffffff6a0._0_8_;
  x_05[2] = in_stack_fffffffffffff6a0._8_8_;
  x_05[3] = in_stack_fffffffffffff6a0._16_8_;
  x_05[0] = 0x15f7e3;
  uVar18 = avx2_sum_epu64(x_05);
  in_RDX[6] = in_RDX[6] + (int)(uVar18 >> 4);
  x_06[1] = in_stack_fffffffffffff6a0._0_8_;
  x_06[2] = in_stack_fffffffffffff6a0._8_8_;
  x_06[3] = in_stack_fffffffffffff6a0._16_8_;
  x_06[0] = 0x15f809;
  uVar18 = avx2_sum_epu64(x_06);
  in_RDX[7] = in_RDX[7] + (int)(uVar18 >> 4);
  pospopcnt_u8_scalar_naive(local_528,in_RSI & 0xff,in_RDX);
  return;
}

Assistant:

void pospopcnt_u8_avx2_horizreduce(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m256i zero = _mm256_setzero_si256();

    __m256i counter_a = zero;
    __m256i counter_b = zero;
    __m256i counter_c = zero;
    __m256i counter_d = zero;
    __m256i counter_e = zero;
    __m256i counter_f = zero;
    __m256i counter_g = zero;
    __m256i counter_h = zero;

    for (const uint8_t* end = &data[(len & ~127)]; data != end; data += 128) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m256i r0 = _mm256_loadu_si256((__m256i*)&data[0*32]);
        const __m256i r1 = _mm256_loadu_si256((__m256i*)&data[1*32]);
        const __m256i r2 = _mm256_loadu_si256((__m256i*)&data[2*32]);
        const __m256i r3 = _mm256_loadu_si256((__m256i*)&data[3*32]);

        // s0 = [a0+a1|c0+c1|e0+e1|g0+g1]
        // s1 = [b0+b1|d0+d1|f0+f1|h0+h1]
        // s2 = [a2+a3|c2+c3|e2+e3|g2+g3]
        // s3 = [b2+b3|d2+d3|f2+f3|h2+h3]
        const __m256i s0 = avx2_add1_even(r0, r1);
        const __m256i s1 = avx2_add1_odd (r0, r1);
        const __m256i s2 = avx2_add1_even(r2, r3);
        const __m256i s3 = avx2_add1_odd (r2, r3);

        // d0 = [a0+a1+a2+a3|e0+e1+e2+e3]
        // d1 = [b0+b1+b2+b3|f0+f1+f2+f3]
        // d2 = [c0+c1+c2+c3|g0+g1+g2+g3]
        // d3 = [d0+d1+d2+d3|h0+h1+h2+h3]
        const __m256i d0 = avx2_add2_even(s0, s2);
        const __m256i d1 = avx2_add2_even(s1, s3);
        const __m256i d2 = avx2_add2_odd (s0, s2);
        const __m256i d3 = avx2_add2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m256i mask_lo = _mm256_set1_epi8(0x0f);
        const __m256i mask_hi = _mm256_set1_epi8(0xf0);
        // Note: counter for higher nibble have to be divided by 16
        const __m256i sum0 = _mm256_sad_epu8(d0 & mask_lo, zero);
        const __m256i sum1 = _mm256_sad_epu8(d0 & mask_hi, zero);
        const __m256i sum2 = _mm256_sad_epu8(d1 & mask_lo, zero);
        const __m256i sum3 = _mm256_sad_epu8(d1 & mask_hi, zero);
        const __m256i sum4 = _mm256_sad_epu8(d2 & mask_lo, zero);
        const __m256i sum5 = _mm256_sad_epu8(d2 & mask_hi, zero);
        const __m256i sum6 = _mm256_sad_epu8(d3 & mask_lo, zero);
        const __m256i sum7 = _mm256_sad_epu8(d3 & mask_hi, zero);

        counter_a = _mm256_add_epi64(counter_a, sum0);
        counter_b = _mm256_add_epi64(counter_b, sum1);
        counter_c = _mm256_add_epi64(counter_c, sum2);
        counter_d = _mm256_add_epi64(counter_d, sum3);
        counter_e = _mm256_add_epi64(counter_e, sum4);
        counter_f = _mm256_add_epi64(counter_f, sum5);
        counter_g = _mm256_add_epi64(counter_g, sum6);
        counter_h = _mm256_add_epi64(counter_h, sum7);
    }

    flag_counts[0] += avx2_sum_epu64(counter_a);
    flag_counts[1] += avx2_sum_epu64(counter_c);
    flag_counts[2] += avx2_sum_epu64(counter_e);
    flag_counts[3] += avx2_sum_epu64(counter_g);
    flag_counts[4] += avx2_sum_epu64(counter_b) >> 4;
    flag_counts[5] += avx2_sum_epu64(counter_d) >> 4;
    flag_counts[6] += avx2_sum_epu64(counter_f) >> 4;
    flag_counts[7] += avx2_sum_epu64(counter_h) >> 4;

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % 256, flag_counts);
}